

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall Catch::RunContext::handleUnfinishedSections(RunContext *this)

{
  __normal_iterator<Catch::SectionEndInfo_*,_std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>_>
  __tmp;
  pointer pSVar1;
  pointer __pos;
  
  __pos = (this->m_unfinishedSections).
          super__Vector_base<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>._M_impl.
          super__Vector_impl_data._M_start;
  pSVar1 = (this->m_unfinishedSections).
           super__Vector_base<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (pSVar1 != __pos) {
    do {
      pSVar1 = pSVar1 + -1;
      (*(this->super_IResultCapture)._vptr_IResultCapture[3])(this,pSVar1);
    } while (pSVar1 != __pos);
    __pos = (this->m_unfinishedSections).
            super__Vector_base<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>.
            _M_impl.super__Vector_impl_data._M_start;
  }
  std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>::_M_erase_at_end
            (&this->m_unfinishedSections,__pos);
  return;
}

Assistant:

void RunContext::handleUnfinishedSections() {
        // If sections ended prematurely due to an exception we stored their
        // infos here so we can tear them down outside the unwind process.
        for (auto it = m_unfinishedSections.rbegin(),
            itEnd = m_unfinishedSections.rend();
            it != itEnd;
            ++it)
            sectionEnded(*it);
        m_unfinishedSections.clear();
    }